

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O2

void enet_peer_dispatch_incoming_reliable_commands
               (ENetPeer *peer,ENetChannel *channel,ENetIncomingCommand *queuedCommand)

{
  ENetList *pEVar1;
  ENetList *pEVar2;
  ushort uVar3;
  ushort uVar4;
  uint16_t uVar5;
  int iVar6;
  _ENetListNode *p_Var7;
  _ENetListNode *p_Var8;
  _ENetListNode *p_Var9;
  _ENetHost *p_Var10;
  _ENetListNode *p_Var11;
  ENetIncomingCommand *incomingCommand;
  ENetListIterator first;
  _ENetListNode *p_Var12;
  ENetListIterator pEVar13;
  ushort uVar14;
  
  pEVar1 = &channel->incomingReliableCommands;
  p_Var11 = &pEVar1->sentinel;
  while (((p_Var11 = ((ENetListNode *)&p_Var11->next)->next, p_Var11 != &pEVar1->sentinel &&
          (*(int *)&p_Var11[4].previous == 0)) &&
         (uVar5 = *(uint16_t *)&p_Var11[1].next,
         uVar5 == (uint16_t)(channel->incomingReliableSequenceNumber + 1)))) {
    channel->incomingReliableSequenceNumber = uVar5;
    iVar6 = *(int *)((long)&p_Var11[4].next + 4);
    if (iVar6 != 0) {
      channel->incomingReliableSequenceNumber = (uVar5 + (short)iVar6) - 1;
    }
  }
  p_Var12 = (pEVar1->sentinel).next;
  if (p_Var11 != p_Var12) {
    channel->incomingUnreliableSequenceNumber = 0;
    p_Var11 = p_Var11->previous;
    p_Var8 = p_Var11->next;
    p_Var9 = p_Var12->previous;
    p_Var9->next = p_Var8;
    p_Var8->previous = p_Var9;
    p_Var8 = (peer->dispatchedCommands).sentinel.previous;
    p_Var12->previous = p_Var8;
    p_Var11->next = &(peer->dispatchedCommands).sentinel;
    p_Var8->next = p_Var12;
    (peer->dispatchedCommands).sentinel.previous = p_Var11;
    if (peer->needsDispatch == 0) {
      p_Var10 = peer->host;
      p_Var11 = (p_Var10->dispatchQueue).sentinel.previous;
      (peer->dispatchList).previous = p_Var11;
      (peer->dispatchList).next = &(p_Var10->dispatchQueue).sentinel;
      p_Var11->next = &peer->dispatchList;
      (p_Var10->dispatchQueue).sentinel.previous = &peer->dispatchList;
      peer->needsDispatch = 1;
    }
    if ((channel->incomingUnreliableCommands).sentinel.next !=
        &(channel->incomingUnreliableCommands).sentinel) {
      pEVar1 = &channel->incomingUnreliableCommands;
      pEVar2 = &peer->dispatchedCommands;
      p_Var11 = (channel->incomingUnreliableCommands).sentinel.next;
      pEVar13 = p_Var11;
      for (p_Var12 = p_Var11; p_Var12 != &pEVar1->sentinel; p_Var12 = p_Var12->next) {
        if (((ulong)p_Var12[1].next & 0xf00000000) != 0x900000000) {
          uVar3 = *(ushort *)&p_Var12[1].next;
          uVar4 = channel->incomingReliableSequenceNumber;
          if (uVar3 == uVar4) {
            if (*(int *)&p_Var12[4].previous == 0) {
              channel->incomingUnreliableSequenceNumber = *(uint16_t *)((long)&p_Var12[1].next + 2);
              goto LAB_001060bc;
            }
            if (pEVar13 == p_Var12) {
              if (p_Var11 != p_Var12) {
                p_Var11 = p_Var12->previous;
              }
            }
            else {
              p_Var11 = p_Var12->previous;
              p_Var8 = p_Var11->next;
              p_Var9 = pEVar13->previous;
              p_Var9->next = p_Var8;
              p_Var8->previous = p_Var9;
              p_Var8 = (peer->dispatchedCommands).sentinel.previous;
              pEVar13->previous = p_Var8;
              p_Var11->next = &pEVar2->sentinel;
              p_Var8->next = pEVar13;
              (peer->dispatchedCommands).sentinel.previous = p_Var11;
              p_Var11 = p_Var12;
              if (peer->needsDispatch == 0) {
                p_Var10 = peer->host;
                p_Var11 = (p_Var10->dispatchQueue).sentinel.previous;
                (peer->dispatchList).previous = p_Var11;
                (peer->dispatchList).next = &(p_Var10->dispatchQueue).sentinel;
                p_Var11->next = &peer->dispatchList;
                (p_Var10->dispatchQueue).sentinel.previous = &peer->dispatchList;
                peer->needsDispatch = 1;
                p_Var11 = p_Var12;
              }
            }
          }
          else {
            uVar14 = (uVar3 >> 0xc) + 0x10;
            if (uVar4 <= uVar3) {
              uVar14 = uVar3 >> 0xc;
            }
            if (uVar4 >> 0xc <= uVar14 && uVar14 < (ushort)((uVar4 >> 0xc) + 7)) break;
            p_Var11 = p_Var12->next;
            if (pEVar13 != p_Var12) {
              p_Var8 = p_Var12->previous;
              p_Var9 = p_Var8->next;
              p_Var7 = pEVar13->previous;
              p_Var7->next = p_Var9;
              p_Var9->previous = p_Var7;
              p_Var9 = (peer->dispatchedCommands).sentinel.previous;
              pEVar13->previous = p_Var9;
              p_Var8->next = &pEVar2->sentinel;
              p_Var9->next = pEVar13;
              (peer->dispatchedCommands).sentinel.previous = p_Var8;
              if (peer->needsDispatch == 0) {
                p_Var10 = peer->host;
                p_Var8 = (p_Var10->dispatchQueue).sentinel.previous;
                (peer->dispatchList).previous = p_Var8;
                (peer->dispatchList).next = &(p_Var10->dispatchQueue).sentinel;
                p_Var8->next = &peer->dispatchList;
                (p_Var10->dispatchQueue).sentinel.previous = &peer->dispatchList;
                peer->needsDispatch = 1;
              }
            }
          }
          pEVar13 = p_Var12->next;
        }
LAB_001060bc:
      }
      if (pEVar13 != p_Var12) {
        p_Var11 = p_Var12->previous;
        p_Var8 = p_Var11->next;
        p_Var9 = pEVar13->previous;
        p_Var9->next = p_Var8;
        p_Var8->previous = p_Var9;
        p_Var8 = (peer->dispatchedCommands).sentinel.previous;
        pEVar13->previous = p_Var8;
        p_Var11->next = &pEVar2->sentinel;
        p_Var8->next = pEVar13;
        (peer->dispatchedCommands).sentinel.previous = p_Var11;
        p_Var11 = p_Var12;
        if (peer->needsDispatch == 0) {
          p_Var10 = peer->host;
          p_Var11 = (p_Var10->dispatchQueue).sentinel.previous;
          (peer->dispatchList).previous = p_Var11;
          (peer->dispatchList).next = &(p_Var10->dispatchQueue).sentinel;
          p_Var11->next = &peer->dispatchList;
          (p_Var10->dispatchQueue).sentinel.previous = &peer->dispatchList;
          peer->needsDispatch = 1;
          p_Var11 = p_Var12;
        }
      }
      enet_peer_remove_incoming_commands
                ((ENetList *)(pEVar1->sentinel).next,p_Var11,&queuedCommand->incomingCommandList,
                 (ENetIncomingCommand *)pEVar1);
      return;
    }
  }
  return;
}

Assistant:

void enet_peer_dispatch_incoming_reliable_commands(ENetPeer* peer, ENetChannel* channel, ENetIncomingCommand* queuedCommand) {
	ENetListIterator currentCommand;

	for (currentCommand = enet_list_begin(&channel->incomingReliableCommands); currentCommand != enet_list_end(&channel->incomingReliableCommands); currentCommand = enet_list_next(currentCommand)) {
		ENetIncomingCommand* incomingCommand = (ENetIncomingCommand*)currentCommand;

		if (incomingCommand->fragmentsRemaining > 0 || incomingCommand->reliableSequenceNumber != (uint16_t)(channel->incomingReliableSequenceNumber + 1))
			break;

		channel->incomingReliableSequenceNumber = incomingCommand->reliableSequenceNumber;

		if (incomingCommand->fragmentCount > 0)
			channel->incomingReliableSequenceNumber += incomingCommand->fragmentCount - 1;
	}

	if (currentCommand == enet_list_begin(&channel->incomingReliableCommands))
		return;

	channel->incomingUnreliableSequenceNumber = 0;

	enet_list_move(enet_list_end(&peer->dispatchedCommands), enet_list_begin(&channel->incomingReliableCommands), enet_list_previous(currentCommand));

	if (!peer->needsDispatch) {
		enet_list_insert(enet_list_end(&peer->host->dispatchQueue), &peer->dispatchList);

		peer->needsDispatch = 1;
	}

	if (!enet_list_empty(&channel->incomingUnreliableCommands))
		enet_peer_dispatch_incoming_unreliable_commands(peer, channel, queuedCommand);
}